

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O2

int main(void)

{
  rle16_t *prVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint32_t uVar8;
  run_container_t *prVar9;
  ulong uVar10;
  void *pvVar11;
  void *__ptr;
  ulong uVar12;
  run_container_t *run;
  run_container_t *BO;
  uint16_t uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int x_2;
  int iVar19;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ushort uVar24;
  uint uVar25;
  short sVar26;
  int j;
  int x;
  uint uVar27;
  int x_1;
  int iVar28;
  bool bVar29;
  bool bVar30;
  float fVar31;
  timespec ts;
  
  puVar4 = (uint *)cpuid_Version_info(1);
  uVar15 = (ulong)puVar4[2];
  uVar5 = *puVar4 >> 4;
  uVar27 = uVar5 - 0x2065;
  if (uVar27 < 0xb) {
    uVar15 = 0x481;
    if ((0x481U >> (uVar27 & 0x1f) & 1) != 0) {
      pcVar20 = "Westmere";
      goto LAB_001014ce;
    }
    uVar15 = 0x120;
    if ((0x120U >> (uVar27 & 0x1f) & 1) != 0) {
      pcVar20 = "SandyBridge";
      goto LAB_001014ce;
    }
    if (uVar27 != 9) goto LAB_001011f3;
switchD_001013ae_caseD_106a:
    pcVar20 = "Nehalem";
LAB_001014ce:
    iVar28 = 0;
    printf("x64 processor:  %s\t",pcVar20,uVar15);
    printf(" compiler version: %s\t",
           "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
    putchar(10);
    lVar18 = cpuid(0x80000006);
    if ((char)*(undefined4 *)(lVar18 + 0xc) != '@') {
      lVar18 = cpuid(0x80000006);
      printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar18 + 0xc),
             (ulong)*(uint *)(lVar18 + 8),(ulong)*(uint *)(lVar18 + 0xc));
    }
    puts("run container benchmarks");
    prVar9 = run_container_create();
    printf("%s: ","add_test(B)");
    fflush((FILE *)0x0);
    uVar15 = 0xffffffffffffffff;
    for (; iVar28 != 500; iVar28 = iVar28 + 1) {
      clock_gettime(3,(timespec *)&ts);
      lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      for (uVar27 = 0; uVar27 < 0x10000; uVar27 = uVar27 + 3) {
        run_container_add(prVar9,(uint16_t)uVar27);
      }
      clock_gettime(3,(timespec *)&ts);
      uVar10 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
               (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
      if (uVar10 < uVar15) {
        uVar15 = uVar10;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar15 * 0.00048828125));
    putchar(10);
    bVar30 = false;
    fflush((FILE *)0x0);
    iVar28 = contains_test(prVar9);
    printf("%s: ","contains_test(B)");
    fflush((FILE *)0x0);
    iVar19 = 500;
    uVar15 = 0xffffffffffffffff;
    while (bVar29 = iVar19 != 0, iVar19 = iVar19 + -1, bVar29) {
      clock_gettime(3,(timespec *)&ts);
      lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      iVar6 = contains_test(prVar9);
      if (iVar6 != iVar28) {
        bVar30 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar10 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
               (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
      if (uVar10 < uVar15) {
        uVar15 = uVar10;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar15 * 1.5258789e-05));
    if (bVar30) {
      printf(" [ERROR]");
    }
    putchar(10);
    fflush((FILE *)0x0);
    printf("%s: ");
    fflush((FILE *)0x0);
    uVar15 = 0xffffffffffffffff;
    for (iVar28 = 0; iVar28 != 500; iVar28 = iVar28 + 1) {
      clock_gettime(3,(timespec *)&ts);
      lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      sVar26 = -1;
      for (uVar27 = 0; uVar27 < 0x10000; uVar27 = uVar27 + 3) {
        uVar13 = (uint16_t)uVar27;
        uVar5 = interleavedBinarySearch(prVar9->runs,prVar9->n_runs,uVar13);
        if ((int)uVar5 < 0) {
          if (uVar5 != 0xffffffff) {
            uVar7 = -uVar5 - 2;
            prVar3 = prVar9->runs;
            uVar24 = prVar3[uVar7].value;
            uVar2 = prVar3[uVar7].length;
            if ((int)(uVar27 - uVar24) < (int)(uint)uVar2) {
              prVar3[uVar7].length = ~uVar24 + uVar13;
              uVar5 = ~uVar5;
              makeRoomAtIndex(prVar9,(uint16_t)uVar5);
              prVar3 = prVar9->runs;
              prVar3[uVar5].value = uVar13 + 1;
              prVar3[uVar5].length = uVar2 + uVar24 + sVar26;
            }
            else if (uVar27 - uVar24 == (uint)uVar2) {
              prVar3[uVar7].length = uVar2 - 1;
            }
          }
        }
        else {
          prVar3 = prVar9->runs;
          uVar13 = prVar3[uVar5].length;
          if (uVar13 == 0) {
            uVar5 = uVar5 & 0xffff;
            memmove(prVar3 + uVar5,prVar3 + (ulong)uVar5 + 1,
                    (long)(int)(~uVar5 + prVar9->n_runs) << 2);
            prVar9->n_runs = prVar9->n_runs + -1;
          }
          else {
            prVar3[uVar5].value = prVar3[uVar5].value + 1;
            prVar3[uVar5].length = uVar13 - 1;
          }
        }
        sVar26 = sVar26 + -3;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar10 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
               (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
      if (uVar10 < uVar15) {
        uVar15 = uVar10;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar15 / 21845.0));
    putchar(10);
    fflush((FILE *)0x0);
    run_container_free(prVar9);
    for (uVar27 = 0x20; uVar27 < 0x10001; uVar27 = uVar27 << 3) {
      prVar9 = run_container_create();
      uVar5 = uVar27;
      while (bVar30 = uVar5 != 0, uVar5 = uVar5 - 1, bVar30) {
        uVar8 = pcg32_random();
        run_container_add(prVar9,(uint16_t)uVar8);
      }
      pvVar11 = malloc(0x800);
      uVar5 = run_container_cardinality(prVar9);
      bVar30 = false;
      printf("\n number of values in container = %d\n",(ulong)uVar5);
      uVar5 = run_container_cardinality(prVar9);
      uVar10 = (ulong)(int)uVar5;
      __ptr = malloc(uVar10 * 4);
      printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
      fflush((FILE *)0x0);
      iVar28 = 500;
      uVar15 = 0xffffffffffffffff;
      while (bVar29 = iVar28 != 0, iVar28 = iVar28 + -1, bVar29) {
        clock_gettime(3,(timespec *)&ts);
        lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
        lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
        uVar7 = run_container_to_uint32_array(__ptr,prVar9,0x4d2);
        if (uVar7 != uVar5) {
          bVar30 = true;
        }
        clock_gettime(3,(timespec *)&ts);
        uVar12 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
                 (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
        if (uVar12 < uVar15) {
          uVar15 = uVar12;
        }
      }
      if ((long)uVar10 < 0) {
        fVar31 = (float)((ulong)(uVar5 & 1) | uVar10 >> 1);
        fVar31 = fVar31 + fVar31;
      }
      else {
        fVar31 = (float)(int)uVar5;
      }
      printf(" %.2f cycles per operation",(double)((float)uVar15 / fVar31));
      if (bVar30) {
        printf(" [ERROR]");
      }
      putchar(10);
      fflush((FILE *)0x0);
      free(__ptr);
      printf("%s %s: ","run_container_contains","run_cache_prefetch");
      fflush((FILE *)0x0);
      iVar28 = 0;
      for (lVar18 = 0; lVar18 != 0x400; lVar18 = lVar18 + 1) {
        lVar17 = cpuid(0x80000006);
        for (lVar16 = 0;
            SBORROW8(lVar16,(long)prVar9->n_runs * 2) != lVar16 + (long)prVar9->n_runs * -2 < 0;
            lVar16 = lVar16 + (ulong)(*(uint *)(lVar17 + 0xc) >> 1 & 0x7f)) {
        }
        clock_gettime(3,(timespec *)&ts);
        iVar6 = (int)ts.tv_nsec;
        iVar19 = (int)ts.tv_sec;
        run_container_contains(prVar9,*(uint16_t *)((long)pvVar11 + lVar18 * 2));
        clock_gettime(3,(timespec *)&ts);
        iVar28 = iVar28 + ((int)ts.tv_nsec - iVar6) + ((int)ts.tv_sec - iVar19) * 1000000000;
      }
      printf(" %.2f cycles per operation",(double)((float)iVar28 * 0.0009765625));
      putchar(10);
      fflush((FILE *)0x0);
      printf("%s %s: ","run_container_contains","run_cache_flush");
      fflush((FILE *)0x0);
      iVar28 = 0;
      for (lVar18 = 0; lVar18 != 0x400; lVar18 = lVar18 + 1) {
        lVar17 = cpuid(0x80000006);
        uVar5 = *(uint *)(lVar17 + 0xc) >> 1 & 0x7f;
        lVar17 = 0;
        for (lVar16 = 0;
            SBORROW8(lVar16,(long)prVar9->n_runs * 2) != lVar16 + (long)prVar9->n_runs * -2 < 0;
            lVar16 = lVar16 + (ulong)uVar5) {
          clflush(*(undefined1 *)((long)&prVar9->runs->value + lVar17));
          lVar17 = lVar17 + (ulong)(uVar5 << 2);
        }
        clock_gettime(3,(timespec *)&ts);
        iVar6 = (int)ts.tv_nsec;
        iVar19 = (int)ts.tv_sec;
        run_container_contains(prVar9,*(uint16_t *)((long)pvVar11 + lVar18 * 2));
        clock_gettime(3,(timespec *)&ts);
        iVar28 = iVar28 + ((int)ts.tv_nsec - iVar6) + ((int)ts.tv_sec - iVar19) * 1000000000;
      }
      printf(" %.2f cycles per operation",(double)((float)iVar28 * 0.0009765625));
      putchar(10);
      fflush((FILE *)0x0);
      free(pvVar11);
      run_container_free(prVar9);
    }
    puts("==dense range test ");
    uVar27 = 0x20;
    do {
      if (0x10000 < uVar27) {
        putchar(10);
        prVar9 = run_container_create();
        for (uVar27 = 0; uVar27 < 0x10000; uVar27 = uVar27 + 3) {
          run_container_add(prVar9,(uint16_t)uVar27);
        }
        run = run_container_create();
        for (uVar27 = 0; uVar27 < 0x10000; uVar27 = uVar27 + 5) {
          run_container_add(run,(uint16_t)uVar27);
        }
        BO = run_container_create();
        puts("\nUnion and intersections...");
        puts("\nNote:");
        puts("union times are expressed in cycles per number of input elements (both runs)");
        puts("intersection times are expressed in cycles per number of output elements\n");
        puts("==intersection and union test 1 ");
        uVar27 = run_container_cardinality(prVar9);
        uVar5 = run_container_cardinality(run);
        bVar30 = false;
        printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar27,(ulong)uVar5);
        uVar27 = union_test(prVar9,run,BO);
        printf("union cardinality = %d \n",(ulong)uVar27);
        uVar5 = run_container_cardinality(prVar9);
        uVar7 = run_container_cardinality(run);
        printf("B1 card = %d B2 card = %d \n",(ulong)uVar5,(ulong)uVar7);
        iVar28 = prVar9->n_runs;
        iVar19 = run->n_runs;
        printf("%s: ","union_test(B1, B2, BO)");
        fflush((FILE *)0x0);
        iVar6 = 500;
        uVar15 = 0xffffffffffffffff;
        while (bVar29 = iVar6 != 0, iVar6 = iVar6 + -1, bVar29) {
          clock_gettime(3,(timespec *)&ts);
          lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
          lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
          uVar5 = union_test(prVar9,run,BO);
          if (uVar5 != uVar27) {
            bVar30 = true;
          }
          clock_gettime(3,(timespec *)&ts);
          uVar10 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
                   (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
          if (uVar10 < uVar15) {
            uVar15 = uVar10;
          }
        }
        printf(" %.2f cycles per operation",
               (double)((float)uVar15 / (float)(ulong)((long)iVar19 + (long)iVar28)));
        if (bVar30) {
          printf(" [ERROR]");
        }
        putchar(10);
        bVar30 = false;
        fflush((FILE *)0x0);
        uVar27 = intersection_test(prVar9,run,BO);
        printf("intersection cardinality = %d \n",(ulong)uVar27);
        printf("%s: ","intersection_test(B1, B2, BO)");
        fflush((FILE *)0x0);
        iVar28 = 500;
        uVar15 = 0xffffffffffffffff;
        while (bVar29 = iVar28 != 0, iVar28 = iVar28 + -1, bVar29) {
          clock_gettime(3,(timespec *)&ts);
          lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
          lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
          uVar5 = intersection_test(prVar9,run,BO);
          if (uVar5 != uVar27) {
            bVar30 = true;
          }
          clock_gettime(3,(timespec *)&ts);
          uVar10 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
                   (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
          if (uVar10 < uVar15) {
            uVar15 = uVar10;
          }
        }
        if ((long)(int)uVar27 < 0) {
          fVar31 = (float)((ulong)(uVar27 & 1) | (ulong)(long)(int)uVar27 >> 1);
          fVar31 = fVar31 + fVar31;
        }
        else {
          fVar31 = (float)(int)uVar27;
        }
        printf(" %.2f cycles per operation",(double)((float)uVar15 / fVar31));
        if (bVar30) {
          printf(" [ERROR]");
        }
        putchar(10);
        fflush((FILE *)0x0);
        puts("==intersection and union test 2 ");
        prVar9->n_runs = 0;
        run->n_runs = 0;
        for (uVar27 = 0; uVar27 < 0x10000; uVar27 = uVar27 + 0x40) {
          for (uVar5 = 0; (uVar27 & 0xffff) % 0xb != uVar5; uVar5 = uVar5 + 1) {
            run_container_add(prVar9,(short)uVar27 + (short)uVar5);
          }
        }
        for (iVar28 = 1; iVar28 < 0x10000; iVar28 = iVar28 * 2) {
          run_container_add(run,(uint16_t)iVar28);
        }
        uVar27 = run_container_cardinality(prVar9);
        uVar5 = run_container_cardinality(run);
        bVar30 = false;
        printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar27,(ulong)uVar5);
        uVar27 = union_test(prVar9,run,BO);
        printf("union cardinality = %d \n",(ulong)uVar27);
        uVar5 = run_container_cardinality(prVar9);
        uVar7 = run_container_cardinality(run);
        printf("B1 card = %d B2 card = %d \n",(ulong)uVar5,(ulong)uVar7);
        iVar28 = prVar9->n_runs;
        iVar19 = run->n_runs;
        printf("%s: ","union_test(B1, B2, BO)");
        fflush((FILE *)0x0);
        iVar6 = 500;
        uVar15 = 0xffffffffffffffff;
        while (bVar29 = iVar6 != 0, iVar6 = iVar6 + -1, bVar29) {
          clock_gettime(3,(timespec *)&ts);
          lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
          lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
          uVar5 = union_test(prVar9,run,BO);
          if (uVar5 != uVar27) {
            bVar30 = true;
          }
          clock_gettime(3,(timespec *)&ts);
          uVar10 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
                   (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
          if (uVar10 < uVar15) {
            uVar15 = uVar10;
          }
        }
        printf(" %.2f cycles per operation",
               (double)((float)uVar15 / (float)(ulong)((long)iVar19 + (long)iVar28)));
        if (bVar30) {
          printf(" [ERROR]");
        }
        putchar(10);
        bVar30 = false;
        fflush((FILE *)0x0);
        uVar27 = intersection_test(prVar9,run,BO);
        printf("intersection cardinality = %d \n",(ulong)uVar27);
        printf("%s: ","intersection_test(B1, B2, BO)");
        fflush((FILE *)0x0);
        iVar28 = 500;
        uVar15 = 0xffffffffffffffff;
        while (bVar29 = iVar28 != 0, iVar28 = iVar28 + -1, bVar29) {
          clock_gettime(3,(timespec *)&ts);
          lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
          lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
          uVar5 = intersection_test(prVar9,run,BO);
          if (uVar5 != uVar27) {
            bVar30 = true;
          }
          clock_gettime(3,(timespec *)&ts);
          uVar10 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
                   (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
          if (uVar10 < uVar15) {
            uVar15 = uVar10;
          }
        }
        if ((long)(int)uVar27 < 0) {
          fVar31 = (float)((ulong)(uVar27 & 1) | (ulong)(long)(int)uVar27 >> 1);
          fVar31 = fVar31 + fVar31;
        }
        else {
          fVar31 = (float)(int)uVar27;
        }
        printf(" %.2f cycles per operation",(double)((float)uVar15 / fVar31));
        if (bVar30) {
          printf(" [ERROR]");
        }
        putchar(10);
        fflush((FILE *)0x0);
        run_container_free(prVar9);
        run_container_free(run);
        run_container_free(BO);
        return 0;
      }
      prVar9 = run_container_create();
      for (uVar5 = 0; uVar5 != uVar27; uVar5 = uVar5 + 1) {
        uVar8 = pcg32_random();
        uVar25 = uVar8 & 0xfff;
        uVar7 = uVar25 + 0x1000;
        prVar3 = prVar9->runs;
        uVar14 = prVar9->n_runs;
        uVar24 = (ushort)uVar25;
        if (uVar14 == 0) {
          uVar22 = 0;
          iVar28 = 0;
LAB_00101db9:
          uVar15 = 0;
        }
        else {
          uVar22 = 0;
          uVar23 = uVar14;
          do {
            while( true ) {
              if ((int)uVar23 <= (int)uVar22) {
                iVar28 = uVar14 - uVar22;
                if (uVar22 != 0) goto LAB_00101d72;
                goto LAB_00101db9;
              }
              uVar21 = uVar22 + (uVar23 - 1) >> 1;
              if ((ushort)uVar7 <= (ushort)(prVar3[uVar21].length + prVar3[uVar21].value)) break;
              uVar22 = uVar21 + 1;
            }
            uVar23 = uVar21;
          } while ((ushort)(uVar24 + 0x1001) < prVar3[uVar21].value);
          uVar22 = uVar21 + 1;
          iVar28 = ~uVar21 + uVar14;
LAB_00101d72:
          uVar15 = 0;
          uVar10 = (ulong)uVar22;
          do {
            iVar19 = (int)uVar10;
            while( true ) {
              if (iVar19 <= (int)uVar15) goto LAB_00101dbb;
              uVar23 = (uint)((int)uVar15 + iVar19 + -1) >> 1;
              uVar10 = (ulong)uVar23;
              if (uVar25 <= (ushort)(prVar3[uVar10].length + prVar3[uVar10].value) + 1) break;
              uVar15 = (ulong)(uVar23 + 1);
            }
          } while (uVar24 < prVar3[uVar10].value);
          uVar15 = (ulong)uVar23;
        }
LAB_00101dbb:
        if (uVar14 == (int)uVar15 + iVar28) {
          makeRoomAtIndex(prVar9,(uint16_t)uVar15);
          prVar3 = prVar9->runs;
          prVar3[uVar15].value = uVar24;
          prVar3[uVar15].length = (ushort)uVar7 - uVar24;
        }
        else {
          prVar1 = prVar3 + uVar15;
          prVar3 = prVar3 + (int)uVar22;
          uVar14 = (uint)prVar3[-1].length + (uint)prVar3[-1].value;
          if (prVar1->value < uVar25) {
            uVar25 = (uint)prVar1->value;
          }
          if (uVar14 <= uVar7) {
            uVar14 = uVar7;
          }
          prVar1->value = (uint16_t)uVar25;
          prVar1->length = (short)uVar14 - (uint16_t)uVar25;
          memmove(prVar1 + 1,prVar3,(long)iVar28 * 4);
          prVar9->n_runs = (int)uVar15 + iVar28 + 1;
        }
      }
      uVar5 = run_container_cardinality(prVar9);
      bVar30 = false;
      printf("\n number of values in container = %d\n",(ulong)uVar5);
      uVar5 = run_container_cardinality(prVar9);
      uVar10 = (ulong)(int)uVar5;
      pvVar11 = malloc(uVar10 * 4);
      printf("%s: ");
      fflush((FILE *)0x0);
      iVar28 = 500;
      uVar15 = 0xffffffffffffffff;
      while (bVar29 = iVar28 != 0, iVar28 = iVar28 + -1, bVar29) {
        clock_gettime(3,(timespec *)&ts);
        lVar18 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
        lVar17 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
        uVar7 = run_container_to_uint32_array(pvVar11,prVar9,0x4d2);
        if (uVar7 != uVar5) {
          bVar30 = true;
        }
        clock_gettime(3,(timespec *)&ts);
        uVar12 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar18) * 1000000000 +
                 (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar17);
        if (uVar12 < uVar15) {
          uVar15 = uVar12;
        }
      }
      if ((long)uVar10 < 0) {
        fVar31 = (float)((ulong)(uVar5 & 1) | uVar10 >> 1);
        fVar31 = fVar31 + fVar31;
      }
      else {
        fVar31 = (float)(int)uVar5;
      }
      printf(" %.2f cycles per operation",(double)((float)uVar15 / fVar31));
      if (bVar30) {
        printf(" [ERROR]");
      }
      putchar(10);
      fflush((FILE *)0x0);
      free(pvVar11);
      run_container_free(prVar9);
      uVar27 = uVar27 << 3;
    } while( true );
  }
LAB_001011f3:
  switch(uVar5) {
  case 0x1066:
switchD_001013ae_caseD_1066:
    pcVar20 = "Merom";
    goto LAB_001014ce;
  case 0x1067:
  case 0x106d:
    pcVar20 = "Penryn";
    goto LAB_001014ce;
  case 0x1068:
  case 0x1069:
  case 0x106b:
  case 0x106c:
switchD_001013ae_caseD_1068:
    pcVar20 = "unknown";
    goto LAB_001014ce;
  case 0x106a:
  case 0x106e:
    goto switchD_001013ae_caseD_106a;
  default:
    if (uVar5 - 99 < 2) {
      pcVar20 = "Prescott";
      goto LAB_001014ce;
    }
    if (uVar5 - 0x806c < 2) {
      pcVar20 = "TigerLake";
      goto LAB_001014ce;
    }
    if (uVar5 - 0xa065 < 2) {
      pcVar20 = "Cometlake";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x66) {
      pcVar20 = "Presler";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x6d) {
      pcVar20 = "Dothan";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x6f) goto switchD_001013ae_caseD_1066;
    if (uVar5 == 0x16c) {
      pcVar20 = "Pineview";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x266) {
      pcVar20 = "Lincroft";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x366) {
      pcVar20 = "Cedarview";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x306a) {
      pcVar20 = "IvyBridge";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x306c) {
      pcVar20 = "Haswell";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x306d) {
      pcVar20 = "Broadwell";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x30f1) goto LAB_001013bc;
    if (uVar5 == 0x60f10) {
      pcVar20 = "Zen4";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x506c) {
LAB_0010141c:
      pcVar20 = "Goldmont";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x506e) {
      pcVar20 = "Skylake";
      goto LAB_001014ce;
    }
    if (uVar5 == 0x606a) {
LAB_00101428:
      pcVar20 = "Icelake";
    }
    else {
      if ((uVar5 != 0x60f0) && (uVar5 != 0x60f8)) {
        if (uVar5 == 0x706a) goto LAB_0010141c;
        if (uVar5 == 0x706e) goto LAB_00101428;
        if (uVar5 != 0x70f1) {
          if (uVar5 != 0x806e) {
            if ((uVar5 == 0x9067) || (uVar5 == 0x906a)) {
              pcVar20 = "Alderlake";
              goto LAB_001014ce;
            }
            if (uVar5 != 0x906e) {
              if (uVar5 != 0x90f0) {
                if (uVar5 == 0xa067) {
                  pcVar20 = "Rocketlake";
                  goto LAB_001014ce;
                }
                if (uVar5 == 0xb067) {
                  pcVar20 = "Raptorlake";
                  goto LAB_001014ce;
                }
                if (uVar5 != 0x20f10) {
                  if (uVar5 == 0x40f40) {
                    pcVar20 = "Zen3+";
                    goto LAB_001014ce;
                  }
                  if (uVar5 != 0x50f00) {
                    if (uVar5 == 0x406c) {
                      pcVar20 = "CherryTrail";
                      goto LAB_001014ce;
                    }
                    goto switchD_001013ae_caseD_1068;
                  }
                }
                pcVar20 = "Zen3";
                goto LAB_001014ce;
              }
              goto LAB_001013bc;
            }
          }
          pcVar20 = "Kabylake";
          goto LAB_001014ce;
        }
      }
LAB_001013bc:
      pcVar20 = "Zen2";
    }
    goto LAB_001014ce;
  }
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }

    printf("==dense range test \n");
    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            uint16_t min = (uint16_t)pcg32_random() % 4096;
            uint16_t max = min + 4096;
            int32_t nruns_greater =
                rle16_count_greater(Bt->runs, Bt->n_runs, max);
            int32_t nruns_less =
                rle16_count_less(Bt->runs, Bt->n_runs - nruns_greater, min);
            run_container_add_range_nruns(Bt, min, max, nruns_less,
                                          nruns_greater);
        }
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);

        run_container_free(Bt);
    }

    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}